

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O2

int Mvc_CubeCompareIntOutsideAndUnderMask(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *(uint *)&pC1->field_0x8 & 0xffffff;
  if (uVar1 == 0) {
    uVar1 = pMask->pData[0];
    uVar3 = pC1->pData[0] & ~uVar1;
    uVar2 = ~uVar1 & pC2->pData[0];
    if (uVar3 < uVar2) {
      return -1;
    }
    if (uVar2 < uVar3) {
      return 1;
    }
    uVar2 = pC1->pData[0] & uVar1;
    uVar1 = pC2->pData[0] & uVar1;
    if (uVar2 < uVar1) {
      return -1;
    }
    if (uVar1 < uVar2) {
      return 1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcCompare.c"
                  ,0x120,
                  "int Mvc_CubeCompareIntOutsideAndUnderMask(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *)"
                 );
  }
  uVar2 = uVar1;
  if (uVar1 != 1) {
    while( true ) {
      if ((int)uVar2 < 0) {
        while( true ) {
          if ((int)uVar1 < 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcCompare.c"
                          ,0x16b,
                          "int Mvc_CubeCompareIntOutsideAndUnderMask(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *)"
                         );
          }
          uVar3 = pC1->pData[uVar1] & pMask->pData[uVar1];
          uVar2 = pMask->pData[uVar1] & pC2->pData[uVar1];
          if (uVar3 < uVar2) break;
          uVar1 = uVar1 - 1;
          if (uVar2 < uVar3) {
            return 1;
          }
        }
        return -1;
      }
      uVar4 = pC1->pData[uVar2] & ~pMask->pData[uVar2];
      uVar3 = ~pMask->pData[uVar2] & pC2->pData[uVar2];
      if (uVar4 < uVar3) break;
      uVar2 = uVar2 - 1;
      if (uVar3 < uVar4) {
        return 1;
      }
    }
    return -1;
  }
  uVar1 = *(uint *)&pMask->field_0x14;
  uVar3 = *(uint *)&pC1->field_0x14 & ~uVar1;
  uVar2 = ~uVar1 & *(uint *)&pC2->field_0x14;
  if (uVar3 < uVar2) {
    return -1;
  }
  if (uVar2 < uVar3) {
    return 1;
  }
  uVar2 = pMask->pData[0];
  uVar3 = pC1->pData[0] & ~uVar2;
  uVar4 = ~uVar2 & pC2->pData[0];
  if (uVar3 < uVar4) {
    return -1;
  }
  if (uVar4 < uVar3) {
    return 1;
  }
  uVar3 = *(uint *)&pC1->field_0x14 & uVar1;
  uVar1 = *(uint *)&pC2->field_0x14 & uVar1;
  if (uVar3 < uVar1) {
    return -1;
  }
  if (uVar3 <= uVar1) {
    uVar1 = pC1->pData[0] & uVar2;
    uVar2 = pC2->pData[0] & uVar2;
    if (uVar1 < uVar2) {
      return -1;
    }
    if (uVar2 < uVar1) {
      return 1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcCompare.c"
                  ,0x145,
                  "int Mvc_CubeCompareIntOutsideAndUnderMask(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *)"
                 );
  }
  return 1;
}

Assistant:

int Mvc_CubeCompareIntOutsideAndUnderMask( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    unsigned uBits1, uBits2;

    if ( Mvc_Cube1Words(pC1) )
    {
        // compare the cubes outside the mask
        uBits1 = pC1->pData[0] & ~(pMask->pData[0]);
        uBits2 = pC2->pData[0] & ~(pMask->pData[0]);
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        // compare the cubes under the mask
        uBits1 = pC1->pData[0] & pMask->pData[0];
        uBits2 = pC2->pData[0] & pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        // cubes are equal
        // should never happen
        assert( 0 );
        return 0;
    }
    else if ( Mvc_Cube2Words(pC1) )
    {
        // compare the cubes outside the mask
        uBits1 = pC1->pData[1] & ~(pMask->pData[1]);
        uBits2 = pC2->pData[1] & ~(pMask->pData[1]);
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        uBits1 = pC1->pData[0] & ~(pMask->pData[0]);
        uBits2 = pC2->pData[0] & ~(pMask->pData[0]);
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        // compare the cubes under the mask
        uBits1 = pC1->pData[1] & pMask->pData[1];
        uBits2 = pC2->pData[1] & pMask->pData[1];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        uBits1 = pC1->pData[0] & pMask->pData[0];
        uBits2 = pC2->pData[0] & pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        // cubes are equal
        // should never happen
        assert( 0 );
        return 0;
    }
    else                            
    {
        int i;

        // compare the cubes outside the mask
        for( i = Mvc_CubeReadLast(pC1); i >= 0; i-- )
        {
            uBits1 = pC1->pData[i] & ~(pMask->pData[i]);
            uBits2 = pC2->pData[i] & ~(pMask->pData[i]);
            if ( uBits1 < uBits2 )
                return -1;
            if ( uBits1 > uBits2 )
                return 1;
        }
        // compare the cubes under the mask
        for( i = Mvc_CubeReadLast(pC1); i >= 0; i-- )
        {
            uBits1 = pC1->pData[i] & pMask->pData[i];
            uBits2 = pC2->pData[i] & pMask->pData[i];
            if ( uBits1 < uBits2 )
                return -1;
            if ( uBits1 > uBits2 )
                return 1;
        }
/*
        {
            Mvc_Cover_t * pCover;
            pCover = Mvc_CoverAlloc( NULL, 96 );
            Mvc_CubePrint( pCover, pC1 );
            Mvc_CubePrint( pCover, pC2 );
            Mvc_CubePrint( pCover, pMask );
        }
*/
        // cubes are equal
        // should never happen
        assert( 0 );
        return 0;
    }
}